

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall
Fl_Text_Display::draw_text(Fl_Text_Display *this,int left,int top,int width,int height)

{
  int iVar1;
  int iVar2;
  int visLineNum;
  ulong uVar3;
  
  iVar2 = this->mMaxsize;
  iVar1 = (this->text_area).y;
  if (iVar2 == 0) {
    iVar2 = this->textsize_;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,left,top,(ulong)(uint)width);
  uVar3 = (long)((top - (iVar2 + iVar1)) + 1) / (long)iVar2 & 0xffffffff;
  while (visLineNum = (int)uVar3, visLineNum <= ((height + top) - iVar1) / iVar2 + 1) {
    draw_vline(this,visLineNum,left,width + left,0,0x7fffffff);
    uVar3 = (ulong)(visLineNum + 1);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

void Fl_Text_Display::draw_text( int left, int top, int width, int height ) {
  int fontHeight, firstLine, lastLine, line;

  /* find the line number range of the display */
  fontHeight = mMaxsize ? mMaxsize : textsize_;
  firstLine = ( top - text_area.y - fontHeight + 1 ) / fontHeight;
  lastLine = ( top + height - text_area.y ) / fontHeight + 1;

  fl_push_clip( left, top, width, height );

  /* draw the lines */
  for ( line = firstLine; line <= lastLine; line++ )
    draw_vline( line, left, left + width, 0, INT_MAX );

  fl_pop_clip();
}